

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.c
# Opt level: O2

void assert_string_not_equal_(char *file,int line,char *expression,char *tried,char *expected)

{
  _func_void_TestReporter_ptr_char_ptr_int_int_char_ptr_varargs *p_Var1;
  _Bool _Var2;
  TestReporter *pTVar3;
  char *pcVar4;
  
  pTVar3 = get_test_reporter();
  p_Var1 = pTVar3->assert_true;
  pTVar3 = get_test_reporter();
  _Var2 = strings_are_equal(tried,expected);
  pcVar4 = "NULL";
  if (expected != (char *)0x0) {
    pcVar4 = expected;
  }
  (*p_Var1)(pTVar3,file,line,(uint)!_Var2,"[%s] should not be [%s] but was\n",expression,pcVar4);
  return;
}

Assistant:

void assert_string_not_equal_(const char *file, int line, const char *expression, const char *tried, const char *expected) {
    (*get_test_reporter()->assert_true)(
            get_test_reporter(),
            file,
            line,
            ! strings_are_equal(tried, expected),
            "[%s] should not be [%s] but was\n", expression, show_null_as_the_string_null(expected));
}